

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

int enet_packet_resize(ENetPacket *packet,size_t dataLength)

{
  void *__dest;
  ulong in_RSI;
  long in_RDI;
  enet_uint8 *newData;
  size_t in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if ((*(ulong *)(in_RDI + 0x18) < in_RSI) && ((*(uint *)(in_RDI + 8) & 4) == 0)) {
    __dest = enet_malloc(in_stack_ffffffffffffffe0);
    if (__dest == (void *)0x0) {
      local_4 = -1;
    }
    else {
      memcpy(__dest,*(void **)(in_RDI + 0x10),*(size_t *)(in_RDI + 0x18));
      enet_free((void *)0x106421);
      *(void **)(in_RDI + 0x10) = __dest;
      *(ulong *)(in_RDI + 0x18) = in_RSI;
      local_4 = 0;
    }
  }
  else {
    *(ulong *)(in_RDI + 0x18) = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
enet_packet_resize (ENetPacket * packet, size_t dataLength)
{
    enet_uint8 * newData;
   
    if (dataLength <= packet -> dataLength || (packet -> flags & ENET_PACKET_FLAG_NO_ALLOCATE))
    {
       packet -> dataLength = dataLength;

       return 0;
    }

    newData = (enet_uint8 *) enet_malloc (dataLength);
    if (newData == NULL)
      return -1;

    memcpy (newData, packet -> data, packet -> dataLength);
    enet_free (packet -> data);
    
    packet -> data = newData;
    packet -> dataLength = dataLength;

    return 0;
}